

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::BufferTest::CreateBufferTexture<unsigned_char,2,false>
          (BufferTest *this,bool use_range_version)

{
  GLuint GVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  GLuint GVar6;
  GLenum GVar7;
  GLuint GVar8;
  GLenum GVar9;
  RenderContext *pRVar10;
  undefined4 extraout_var;
  uchar *puVar11;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar12;
  Reference *pRVar13;
  Enum<int,_2UL> EVar14;
  Enum<int,_2UL> local_200;
  GetNameFunc local_1f0;
  int local_1e8;
  Enum<int,_2UL> local_1e0 [2];
  char *local_1c0;
  MessageBuilder local_1b8;
  int local_38;
  int local_34;
  GLenum error;
  GLuint b_size;
  GLuint b_offset;
  GLint alignment;
  Functions *gl;
  BufferTest *pBStack_18;
  bool use_range_version_local;
  BufferTest *this_local;
  
  gl._7_1_ = use_range_version;
  pBStack_18 = this;
  pRVar10 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar10->_vptr_RenderContext[3])();
  _b_offset = CONCAT44(extraout_var,iVar3);
  (**(code **)(_b_offset + 0x6f8))(1,&this->m_to);
  dVar4 = (**(code **)(_b_offset + 0x800))();
  glu::checkError(dVar4,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x34c);
  (**(code **)(_b_offset + 0xb8))(0x8c2a,this->m_to);
  dVar4 = (**(code **)(_b_offset + 0x800))();
  glu::checkError(dVar4,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x34f);
  (**(code **)(_b_offset + 0x6c8))(1,&this->m_bo);
  dVar4 = (**(code **)(_b_offset + 0x800))();
  glu::checkError(dVar4,"glCreateBuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x352);
  (**(code **)(_b_offset + 0x40))(0x8c2a,this->m_bo);
  uVar5 = (**(code **)(_b_offset + 0x800))();
  pRVar13 = (Reference *)(ulong)uVar5;
  glu::checkError(uVar5,"glBindBuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x355);
  if ((gl._7_1_ & 1) == 0) {
    pcVar2 = *(code **)(_b_offset + 0x150);
    GVar6 = TestReferenceDataSize<unsigned_char,2>();
    puVar11 = Reference::ReferenceData<unsigned_char,false>(pRVar13);
    (*pcVar2)(0x8c2a,GVar6,puVar11,0x88e4);
    dVar4 = (**(code **)(_b_offset + 0x800))();
    glu::checkError(dVar4,"glNamedBufferData has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x36d);
    pcVar2 = *(code **)(_b_offset + 0x13d8);
    GVar6 = this->m_to;
    GVar9 = Reference::InternalFormat<unsigned_char,2,false>();
    (*pcVar2)(GVar6,GVar9,this->m_bo);
  }
  else {
    b_size = 1;
    (**(code **)(_b_offset + 0x868))(0x919f,&b_size);
    dVar4 = (**(code **)(_b_offset + 0x800))();
    glu::checkError(dVar4,"glGetIntegerv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x35d);
    error = b_size;
    GVar6 = TestReferenceDataSize<unsigned_char,2>();
    local_34 = GVar6 + error;
    (**(code **)(_b_offset + 0x150))(0x8c2a,local_34,0,0x88e4);
    uVar5 = (**(code **)(_b_offset + 0x800))();
    pRVar13 = (Reference *)(ulong)uVar5;
    glu::checkError(uVar5,"glBufferData has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x363);
    GVar9 = error;
    pcVar2 = *(code **)(_b_offset + 0x168);
    GVar6 = TestReferenceDataSize<unsigned_char,2>();
    puVar11 = Reference::ReferenceData<unsigned_char,false>(pRVar13);
    (*pcVar2)(0x8c2a,GVar9,GVar6,puVar11);
    dVar4 = (**(code **)(_b_offset + 0x800))();
    glu::checkError(dVar4,"glBufferSubdata has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x366);
    pcVar2 = *(code **)(_b_offset + 0x13e0);
    GVar6 = this->m_to;
    GVar7 = Reference::InternalFormat<unsigned_char,2,false>();
    GVar9 = error;
    GVar1 = this->m_bo;
    GVar8 = TestReferenceDataSize<unsigned_char,2>();
    (*pcVar2)(GVar6,GVar7,GVar1,GVar9,GVar8);
  }
  local_38 = (**(code **)(_b_offset + 0x800))();
  if (local_38 == 0) {
    this_local._7_1_ = true;
  }
  else {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    local_1c0 = "glTextureBuffer";
    if ((gl._7_1_ & 1) != 0) {
      local_1c0 = "glTextureBufferRange";
    }
    pMVar12 = tcu::MessageBuilder::operator<<(&local_1b8,&local_1c0);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [31])0x2a84b7c);
    EVar14 = glu::getErrorStr(local_38);
    local_1f0 = EVar14.m_getName;
    local_1e8 = EVar14.m_value;
    local_1e0[0].m_getName = local_1f0;
    local_1e0[0].m_value = local_1e8;
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,local_1e0);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (pMVar12,(char (*) [33])" during test of internal format ");
    GVar9 = Reference::InternalFormat<unsigned_char,2,false>();
    EVar14 = glu::getTextureFormatStr(GVar9);
    local_200.m_getName = EVar14.m_getName;
    local_200.m_value = EVar14.m_value;
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_200);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    CleanBufferTexture(this);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BufferTest::CreateBufferTexture(bool use_range_version)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Objects creation. */
	gl.genTextures(1, &m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_BUFFER, m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.genBuffers(1, &m_bo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers has failed");

	gl.bindBuffer(GL_TEXTURE_BUFFER, m_bo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

	/* Data setup. */
	if (use_range_version)
	{
		glw::GLint alignment = 1;

		gl.getIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT, &alignment);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

		const glw::GLuint b_offset = alignment;
		const glw::GLuint b_size   = TestReferenceDataSize<T, S>() + b_offset;

		gl.bufferData(GL_TEXTURE_BUFFER, b_size, NULL, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData has failed");

		gl.bufferSubData(GL_TEXTURE_BUFFER, b_offset, TestReferenceDataSize<T, S>(), ReferenceData<T, N>());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubdata has failed");

		gl.textureBufferRange(m_to, InternalFormat<T, S, N>(), m_bo, b_offset, TestReferenceDataSize<T, S>());
	}
	else
	{
		gl.bufferData(GL_TEXTURE_BUFFER, TestReferenceDataSize<T, S>(), ReferenceData<T, N>(), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData has failed");

		gl.textureBuffer(m_to, InternalFormat<T, S, N>(), m_bo);
	}

	/* Error checking. */
	glw::GLenum error;

	if (GL_NO_ERROR != (error = gl.getError()))
	{
		/* Log. */
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << (use_range_version ? ("glTextureBufferRange") : ("glTextureBuffer"))
			<< " unexpectedly generated error " << glu::getErrorStr(error) << " during test of internal format "
			<< glu::getTextureFormatStr(InternalFormat<T, S, N>()) << "." << tcu::TestLog::EndMessage;

		CleanBufferTexture();

		return false;
	}

	return true;
}